

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_variables.c
# Opt level: O2

ngx_http_variable_value_t * ngx_http_get_indexed_variable(ngx_http_request_t *r,ngx_uint_t index)

{
  ngx_http_variable_value_t *pnVar1;
  long lVar2;
  long lVar3;
  char *fmt;
  ngx_log_t *log;
  long lVar4;
  ngx_uint_t nStack_40;
  
  if (index < *(ulong *)((long)r->main_conf[ngx_http_core_module.ctx_index] + 0x68)) {
    pnVar1 = r->variables + index;
    if ((r->variables[index].field_0x3 & 0x50) != 0) {
      return pnVar1;
    }
    lVar2 = *(long *)((long)r->main_conf[ngx_http_core_module.ctx_index] + 0x60);
    if (ngx_http_variable_depth == 0) {
      log = r->connection->log;
      if (3 < log->log_level) {
        index = lVar2 + index * 0x38;
        fmt = "cycle while evaluating variable \"%V\"";
        nStack_40 = 4;
        goto LAB_0014612a;
      }
    }
    else {
      ngx_http_variable_depth = ngx_http_variable_depth - 1;
      lVar4 = index * 0x38;
      lVar3 = (**(code **)(lVar2 + 0x18 + lVar4))(r,pnVar1,*(undefined8 *)(lVar2 + 0x20 + lVar4));
      ngx_http_variable_depth = ngx_http_variable_depth + 1;
      if (lVar3 == 0) {
        if ((*(byte *)(lVar2 + lVar4 + 0x28) & 2) != 0) {
          *(uint *)(r->variables + index) = *(uint *)(r->variables + index) | 0x20000000;
        }
        return r->variables + index;
      }
      *(uint *)(r->variables + index) = *(uint *)(r->variables + index) & 0xefffffff;
      *(uint *)(r->variables + index) = *(uint *)(r->variables + index) | 0x40000000;
    }
  }
  else {
    log = r->connection->log;
    if (1 < log->log_level) {
      fmt = "unknown variable index: %ui";
      nStack_40 = 2;
LAB_0014612a:
      ngx_log_error_core(nStack_40,log,0,fmt,index);
      return (ngx_http_variable_value_t *)0x0;
    }
  }
  return (ngx_http_variable_value_t *)0x0;
}

Assistant:

ngx_http_variable_value_t *
ngx_http_get_indexed_variable(ngx_http_request_t *r, ngx_uint_t index)
{
    ngx_http_variable_t        *v;
    ngx_http_core_main_conf_t  *cmcf;

    cmcf = ngx_http_get_module_main_conf(r, ngx_http_core_module);

    if (cmcf->variables.nelts <= index) {
        ngx_log_error(NGX_LOG_ALERT, r->connection->log, 0,
                      "unknown variable index: %ui", index);
        return NULL;
    }

    if (r->variables[index].not_found || r->variables[index].valid) {
        return &r->variables[index];
    }

    v = cmcf->variables.elts;

    if (ngx_http_variable_depth == 0) {
        ngx_log_error(NGX_LOG_ERR, r->connection->log, 0,
                      "cycle while evaluating variable \"%V\"",
                      &v[index].name);
        return NULL;
    }

    ngx_http_variable_depth--;

    if (v[index].get_handler(r, &r->variables[index], v[index].data)
        == NGX_OK)
    {
        ngx_http_variable_depth++;

        if (v[index].flags & NGX_HTTP_VAR_NOCACHEABLE) {
            r->variables[index].no_cacheable = 1;
        }

        return &r->variables[index];
    }

    ngx_http_variable_depth++;

    r->variables[index].valid = 0;
    r->variables[index].not_found = 1;

    return NULL;
}